

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.h
# Opt level: O0

void __thiscall
lf::io::VtkFile::ScalarData<unsigned_int>::ScalarData(ScalarData<unsigned_int> *this)

{
  allocator<char> local_11;
  ScalarData<unsigned_int> *local_10;
  ScalarData<unsigned_int> *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->data);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->lookup_table,"default",&local_11);
  std::allocator<char>::~allocator(&local_11);
  return;
}

Assistant:

ScalarData() = default;